

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_bbdpre.c
# Opt level: O0

int CVBBDPrecGetNumGfnEvals(void *cvode_mem,long *ngevalsBBDP)

{
  undefined8 *in_RSI;
  CVodeMem in_RDI;
  CVBBDPrecData pdata;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-1,0x18d,"CVBBDPrecGetNumGfnEvals",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_bbdpre.c"
                   ,"Integrator memory is NULL.");
    local_4 = -1;
  }
  else if (in_RDI->cv_lmem == (void *)0x0) {
    cvProcessError(in_RDI,-2,0x195,"CVBBDPrecGetNumGfnEvals",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_bbdpre.c"
                   ,
                   "Linear solver memory is NULL. One of the SPILS linear solvers must be attached."
                  );
    local_4 = -2;
  }
  else if (*(long *)((long)in_RDI->cv_lmem + 0xf0) == 0) {
    cvProcessError(in_RDI,-5,0x19d,"CVBBDPrecGetNumGfnEvals",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_bbdpre.c"
                   ,"BBD peconditioner memory is NULL. CVBBDPrecInit must be called.");
    local_4 = -5;
  }
  else {
    *in_RSI = *(undefined8 *)(*(long *)((long)in_RDI->cv_lmem + 0xf0) + 0x90);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVBBDPrecGetNumGfnEvals(void* cvode_mem, long int* ngevalsBBDP)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  CVBBDPrecData pdata;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CVLS_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_NULL);
    return (CVLS_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->cv_lmem == NULL)
  {
    cvProcessError(cv_mem, CVLS_LMEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBBD_LMEM_NULL);
    return (CVLS_LMEM_NULL);
  }
  cvls_mem = (CVLsMem)cv_mem->cv_lmem;

  if (cvls_mem->P_data == NULL)
  {
    cvProcessError(cv_mem, CVLS_PMEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBBD_PMEM_NULL);
    return (CVLS_PMEM_NULL);
  }
  pdata = (CVBBDPrecData)cvls_mem->P_data;

  *ngevalsBBDP = pdata->nge;

  return (CVLS_SUCCESS);
}